

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getRhoe(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  undefined8 local_108;
  EAMAdapter *in_stack_ffffffffffffffa8;
  
  getZhouParam(in_stack_ffffffffffffffa8);
  ZhouParameters::~ZhouParameters(local_108);
  return (RealType)local_108;
}

Assistant:

RealType EAMAdapter::getRhoe() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.rhoe;
  }